

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[7],kj::Array<unsigned_char>&>
          (String *__return_storage_ptr__,kj *this,char (*params) [7],Array<unsigned_char> *params_1
          )

{
  char (*value) [7];
  Array<unsigned_char> *this_00;
  Array<unsigned_char> *value_00;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> local_68;
  ArrayPtr<const_char> local_30;
  Array<unsigned_char> *local_20;
  Array<unsigned_char> *params_local_1;
  char (*params_local) [7];
  
  local_20 = (Array<unsigned_char> *)params;
  params_local_1 = (Array<unsigned_char> *)this;
  params_local = (char (*) [7])__return_storage_ptr__;
  value = ::const((char (*) [7])this);
  local_30 = toCharSequence<char_const(&)[7]>(value);
  this_00 = fwd<kj::Array<unsigned_char>&>(local_20);
  toCharSequence<kj::Array<unsigned_char>&>(&local_68,(kj *)this_00,value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_68,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params_1);
  _::Delimited<kj::ArrayPtr<const_unsigned_char>_>::~Delimited(&local_68);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}